

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall
soul::RewritingASTVisitor::replaceStatement
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Statement> *s)

{
  Statement *local_20;
  
  visitStatement((RewritingASTVisitor *)&local_20,(pool_ptr<soul::AST::Statement> *)this);
  if (s->object != local_20) {
    this->itemsReplaced = this->itemsReplaced + 1;
    s->object = local_20;
  }
  return;
}

Assistant:

void replaceStatement (pool_ptr<AST::Statement>& s)           { replace (s, visitStatement (s)); }